

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall icu_63::number::impl::DecimalQuantity::_setToLong(DecimalQuantity *this,int64_t n)

{
  UErrorCode localStatus;
  DecNum decnum;
  
  if (0x7fffffff < n) {
    readLongToBcd(this,n);
    return;
  }
  readIntToBcd(this,(int32_t)n);
  return;
}

Assistant:

void DecimalQuantity::_setToLong(int64_t n) {
    if (n == INT64_MIN) {
        DecNum decnum;
        UErrorCode localStatus = U_ZERO_ERROR;
        decnum.setTo("9.223372036854775808E+18", localStatus);
        if (U_FAILURE(localStatus)) { return; } // unexpected
        flags |= NEGATIVE_FLAG;
        readDecNumberToBcd(decnum);
    } else if (n <= INT32_MAX) {
        readIntToBcd(static_cast<int32_t>(n));
    } else {
        readLongToBcd(n);
    }
}